

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::InternReadFile
          (DXFImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  aiNode *paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Logger *pLVar4;
  DeadlyImportError *pDVar5;
  FileData *extraout_RDX;
  LineReader *pLVar6;
  shared_ptr<Assimp::IOStream> file;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  FileData output;
  char *local_290 [4];
  LineReader reader;
  char buff [25];
  StreamReaderLE stream;
  aiMatrix4x4t<float> temp;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&temp,"rb",(allocator<char> *)&reader);
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(filename->_M_dataplus)._M_p,CONCAT44(temp.a2,temp.a1));
  std::__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IOStream,void>
            ((__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2> *)&file,
             (IOStream *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&temp);
  if (file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                   "Failed to open DXF file ",filename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,"");
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&temp);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  (*(file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IOStream
    [2])(file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,buff,0x18,1);
  iVar3 = strncmp(AI_DXF_BINARY_IDENT_abi_cxx11_._M_dataplus._M_p,buff,0x18);
  if (iVar3 == 0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&temp,"DXF: Binary files are not supported at the moment",
               (allocator<char> *)&reader);
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&temp);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  (*(file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IOStream
    [4])(file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,0);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2b8,&file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamReader<false,_false>::StreamReader(&stream,(shared_ptr<Assimp::IOStream> *)&local_2b8,false)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
  DXF::LineReader::LineReader(&reader,&stream);
  output.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  output.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  output.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (reader.end < 2) {
    bVar2 = DXF::LineReader::Is(&reader,2,"BLOCKS");
    if (bVar2) {
      ParseBlocks(this,&reader,&output);
    }
    else {
      bVar2 = DXF::LineReader::Is(&reader,2,"ENTITIES");
      if (bVar2) {
        ParseEntities(this,&reader,&output);
      }
      else {
        pLVar6 = &reader;
        bVar2 = DXF::LineReader::Is(&reader,2,"CLASSES");
        if (bVar2) {
LAB_00401063:
          SkipSection((DXFImporter *)pLVar6,&reader);
        }
        else {
          pLVar6 = &reader;
          bVar2 = DXF::LineReader::Is(&reader,2,"TABLES");
          if (bVar2) goto LAB_00401063;
          pLVar6 = &reader;
          bVar2 = DXF::LineReader::Is(&reader,2,"HEADER");
          if (bVar2) {
            ParseHeader((DXFImporter *)pLVar6,&reader,extraout_RDX);
          }
          else {
            if (reader.groupcode == 999) {
              pLVar4 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[14]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &temp,(char (*) [14])"DXF Comment: ");
              std::operator<<((ostream *)&temp,(string *)&reader.value);
              std::__cxx11::stringbuf::str();
              Logger::info(pLVar4,local_290[0]);
              std::__cxx11::string::~string((string *)local_290);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&temp);
            }
            else {
              bVar2 = DXF::LineReader::Is(&reader,0,"EOF");
              if (bVar2) goto LAB_00401143;
            }
            DXF::LineReader::operator++(&reader);
          }
        }
      }
    }
  }
  pLVar4 = DefaultLogger::get();
  Logger::warn(pLVar4,"DXF: EOF reached, but did not encounter DXF EOF marker");
LAB_00401143:
  ConvertMeshes(this,pScene,&output);
  temp.a1 = 1.0;
  temp.a2 = 0.0;
  temp.a3 = 0.0;
  temp.a4 = 0.0;
  temp.b1 = 0.0;
  temp.b2 = 0.0;
  temp.b3 = 1.0;
  temp.b4 = 0.0;
  temp.c1 = 0.0;
  temp.c2 = -1.0;
  temp.c3 = 0.0;
  temp.c4 = 0.0;
  temp.d1 = 0.0;
  temp.d2 = 0.0;
  temp.d3 = 0.0;
  temp.d4 = 1.0;
  aiMatrix4x4t<float>::operator*=(&temp,&pScene->mRootNode->mTransformation);
  paVar1 = pScene->mRootNode;
  (paVar1->mTransformation).d1 = temp.d1;
  (paVar1->mTransformation).d2 = temp.d2;
  (paVar1->mTransformation).d3 = temp.d3;
  (paVar1->mTransformation).d4 = temp.d4;
  (paVar1->mTransformation).c1 = temp.c1;
  (paVar1->mTransformation).c2 = temp.c2;
  (paVar1->mTransformation).c3 = temp.c3;
  (paVar1->mTransformation).c4 = temp.c4;
  (paVar1->mTransformation).b1 = temp.b1;
  (paVar1->mTransformation).b2 = temp.b2;
  (paVar1->mTransformation).b3 = temp.b3;
  (paVar1->mTransformation).b4 = temp.b4;
  (paVar1->mTransformation).a1 = temp.a1;
  (paVar1->mTransformation).a2 = temp.a2;
  (paVar1->mTransformation).a3 = temp.a3;
  (paVar1->mTransformation).a4 = temp.a4;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::~vector(&output.blocks);
  DXF::LineReader::~LineReader(&reader);
  StreamReader<false,_false>::~StreamReader(&stream);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void DXFImporter::InternReadFile( const std::string& filename, aiScene* pScene, IOSystem* pIOHandler) {
    std::shared_ptr<IOStream> file = std::shared_ptr<IOStream>( pIOHandler->Open( filename) );

    // Check whether we can read the file
    if( file.get() == nullptr ) {
        throw DeadlyImportError( "Failed to open DXF file " + filename + "");
    }

    // Check whether this is a binary DXF file - we can't read binary DXF files :-(
    char buff[AI_DXF_BINARY_IDENT_LEN+1] = {0};
    file->Read(buff,AI_DXF_BINARY_IDENT_LEN,1);

    if (0 == strncmp(AI_DXF_BINARY_IDENT.c_str(),buff,AI_DXF_BINARY_IDENT_LEN)) {
        throw DeadlyImportError("DXF: Binary files are not supported at the moment");
    }

    // DXF files can grow very large, so read them via the StreamReader,
    // which will choose a suitable strategy.
    file->Seek(0,aiOrigin_SET);
    StreamReaderLE stream( file );

    DXF::LineReader reader (stream);
    DXF::FileData output;

    // now get all lines of the file and process top-level sections
    bool eof = false;
    while(!reader.End()) {

        // blocks table - these 'build blocks' are later (in ENTITIES)
        // referenced an included via INSERT statements.
        if (reader.Is(2,"BLOCKS")) {
            ParseBlocks(reader,output);
            continue;
        }

        // primary entity table
        if (reader.Is(2,"ENTITIES")) {
            ParseEntities(reader,output);
            continue;
        }

        // skip unneeded sections entirely to avoid any problems with them
        // altogether.
        else if (reader.Is(2,"CLASSES") || reader.Is(2,"TABLES")) {
            SkipSection(reader);
            continue;
        }

        else if (reader.Is(2,"HEADER")) {
            ParseHeader(reader,output);
            continue;
        }

        // comments
        else if (reader.Is(999)) {
            ASSIMP_LOG_INFO_F("DXF Comment: ", reader.Value());
        }

        // don't read past the official EOF sign
        else if (reader.Is(0,"EOF")) {
            eof = true;
            break;
        }

        ++reader;
    }
    if (!eof) {
        ASSIMP_LOG_WARN("DXF: EOF reached, but did not encounter DXF EOF marker");
    }

    ConvertMeshes(pScene,output);

    // Now rotate the whole scene by 90 degrees around the x axis to convert from AutoCAD's to Assimp's coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pScene->mRootNode->mTransformation;
}